

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIOAddScalarArray(FmsIOContext *ctx,char *path,FmsScalarType type,void *values,FmsInt n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float *v;
  
  uVar1 = n << (type == FMS_COMPLEX_FLOAT);
  fprintf((FILE *)ctx->fp,"%s/Size: %lu\n",path,uVar1);
  fprintf((FILE *)ctx->fp,"%s/Type: %s\n",path,FmsScalarTypeNames[type]);
  switch((ulong)type) {
  case 0:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = 0;
        while( true ) {
          fprintf((FILE *)ctx->fp,"%f",(double)*(float *)((long)values + uVar3 * 4));
          if (uVar3 < uVar1 - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar3 = uVar3 + 1;
          if (uVar1 <= uVar3 || 1 < uVar2) break;
          uVar2 = uVar2 + 1;
        }
        if (uVar3 < uVar1 - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
      } while (uVar3 < uVar1);
    }
    break;
  case 1:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = 0;
        while( true ) {
          fprintf((FILE *)ctx->fp,"%f",*(undefined8 *)((long)values + uVar3 * 8));
          if (uVar3 < uVar1 - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar3 = uVar3 + 1;
          if (uVar1 <= uVar3 || 1 < uVar2) break;
          uVar2 = uVar2 + 1;
        }
        if (uVar3 < uVar1 - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
      } while (uVar3 < uVar1);
    }
    break;
  case 2:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = 0;
        while( true ) {
          fprintf((FILE *)ctx->fp,"%f",(double)*(float *)((long)values + uVar3 * 4));
          if (uVar3 < uVar1 - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar3 = uVar3 + 1;
          if (uVar1 <= uVar3 || 1 < uVar2) break;
          uVar2 = uVar2 + 1;
        }
        if (uVar3 < uVar1 - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
      } while (uVar3 < uVar1);
    }
    break;
  case 3:
    fprintf((FILE *)ctx->fp,"%s/Values: [",path);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = 0;
        while( true ) {
          fprintf((FILE *)ctx->fp,"%f",*(undefined8 *)((long)values + uVar3 * 8));
          if (uVar3 < uVar1 - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar3 = uVar3 + 1;
          if (uVar1 <= uVar3 || 1 < uVar2) break;
          uVar2 = uVar2 + 1;
        }
        if (uVar3 < uVar1 - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
      } while (uVar3 < uVar1);
    }
    break;
  default:
    return 1;
  }
  fwrite("]\n",2,1,(FILE *)ctx->fp);
  return 0;
}

Assistant:

static int
FmsIOAddScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType type,
                    const void *values, FmsInt n) {
  /* Shall we stick some type information into the ASCII to preserve the intended IntType? */
  size_t i, j;
  int retval = 0;
  const unsigned int epl = FMS_ELE_PER_LINE;

  if(type == FMS_COMPLEX_FLOAT || type == FMS_COMPLEX_FLOAT)
    n = n * 2;

  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsScalarTypeNames[type]);

#define PRINT_MACRO(typename, T, format)    \
    do {                                    \
    const T *v = (const T *)(values);       \
    fprintf(ctx->fp, "%s/Values: [", path); \
    for(i = 0; i < n;) {                    \
        for(j = 0; j < epl && i < n; j++, i++) { \
            fprintf(ctx->fp, format, v[i]); \
            if(i < n-1)                     \
                fprintf(ctx->fp, ", ");     \
        }                                   \
        if(i < n-1)                         \
            fprintf(ctx->fp, "\n");         \
    }                                       \
    fprintf(ctx->fp, "]\n");                \
    } while(0)

  switch(type) {
#define CASES(typename, T, format)          \
        case typename:                          \
            PRINT_MACRO(typename, T, format);   \
            break;
    FOR_EACH_SCALAR_TYPE(CASES)
#undef CASES
  default:
    E_RETURN(1);
    break;
  }
#undef PRINT_MACRO
  return retval;
}